

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void pq_add(roaring_pq_t *pq,roaring_pq_element_t *t)

{
  uint64_t uVar1;
  undefined7 uVar2;
  _Bool _Var3;
  roaring_pq_element_t *prVar4;
  undefined1 local_40 [8];
  roaring_pq_element_t ap;
  uint64_t p;
  uint64_t i;
  roaring_pq_element_t *t_local;
  roaring_pq_t *pq_local;
  
  p = pq->size;
  uVar1 = pq->size;
  pq->size = uVar1 + 1;
  prVar4 = pq->elements + uVar1;
  prVar4->size = t->size;
  uVar2 = *(undefined7 *)&t->field_0x9;
  prVar4->is_temporary = t->is_temporary;
  *(undefined7 *)&prVar4->field_0x9 = uVar2;
  prVar4->bitmap = t->bitmap;
  while (p != 0) {
    ap.bitmap = (roaring_bitmap_t *)(p - 1 >> 1);
    prVar4 = pq->elements + (long)ap.bitmap;
    local_40 = (undefined1  [8])prVar4->size;
    ap.size = *(uint64_t *)&prVar4->is_temporary;
    ap._8_8_ = prVar4->bitmap;
    _Var3 = compare(t,(roaring_pq_element_t *)local_40);
    if (!_Var3) break;
    prVar4 = pq->elements + p;
    prVar4->size = (uint64_t)local_40;
    *(uint64_t *)&prVar4->is_temporary = ap.size;
    prVar4->bitmap = (roaring_bitmap_t *)ap._8_8_;
    p = (uint64_t)ap.bitmap;
  }
  prVar4 = pq->elements + p;
  prVar4->size = t->size;
  uVar2 = *(undefined7 *)&t->field_0x9;
  prVar4->is_temporary = t->is_temporary;
  *(undefined7 *)&prVar4->field_0x9 = uVar2;
  prVar4->bitmap = t->bitmap;
  return;
}

Assistant:

static void pq_add(roaring_pq_t *pq, roaring_pq_element_t *t) {
    uint64_t i = pq->size;
    pq->elements[pq->size++] = *t;
    while (i > 0) {
        uint64_t p = (i - 1) >> 1;
        roaring_pq_element_t ap = pq->elements[p];
        if (!compare(t, &ap)) break;
        pq->elements[i] = ap;
        i = p;
    }
    pq->elements[i] = *t;
}